

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O0

void teletext_init(void)

{
  restorecrtmode();
  ram_screen_start = 0x7c00;
  screen_byte_P = text_screen_byte;
  update_screen = update_full_text_screen;
  textcolor(0xd);
  return;
}

Assistant:

void teletext_init(void) {
    restorecrtmode();        // Change to a text mode
    ram_screen_start = 0x7C00; // Set screen start
    screen_byte_P = text_screen_byte; // Point screen access function
    update_screen = update_full_text_screen; // point screen update function
    textcolor(WHITE);                      // set text to white colour
    return;
}